

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O2

int rops_tx_credit_h2(lws *wsi,char peer_to_us,int add)

{
  int iVar1;
  int iVar2;
  lws *plVar3;
  
  plVar3 = lws_get_network_wsi(wsi);
  if (add == 0) {
    if (peer_to_us == '\0') {
      iVar1 = lws_h2_tx_cr_get(wsi);
      return iVar1;
    }
    iVar1 = (wsi->txc).peer_tx_cr_est;
    iVar2 = (plVar3->txc).peer_tx_cr_est;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
  }
  else {
    if (peer_to_us == '\x01') {
      iVar1 = lws_h2_update_peer_txcredit(wsi,-1,add);
      return iVar1;
    }
    (wsi->txc).tx_cr = (wsi->txc).tx_cr + add;
    (plVar3->txc).tx_cr = (plVar3->txc).tx_cr + add;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
rops_tx_credit_h2(struct lws *wsi, char peer_to_us, int add)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n;

	if (add) {
		if (peer_to_us == LWSTXCR_PEER_TO_US) {
			/*
			 * We want to tell the peer they can write an additional
			 * "add" bytes to us
			 */
			return lws_h2_update_peer_txcredit(wsi, -1, add);
		}

		/*
		 * We're being told we can write an additional "add" bytes
		 * to the peer
		 */

		wsi->txc.tx_cr += add;
		nwsi->txc.tx_cr += add;

		return 0;
	}

	if (peer_to_us == LWSTXCR_US_TO_PEER)
		return lws_h2_tx_cr_get(wsi);

	n = wsi->txc.peer_tx_cr_est;
	if (n > nwsi->txc.peer_tx_cr_est)
		n = nwsi->txc.peer_tx_cr_est;

	return n;
}